

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_JSONStringify(JSContext *ctx,JSValue obj,JSValue replacer,JSValue space0)

{
  JSValue val_00;
  JSValue val_01;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue v_09;
  JSValue v_10;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue obj_00;
  JSValue val_05;
  JSValue val_06;
  JSValue this_obj;
  JSValue val_07;
  JSValue obj_01;
  JSValue val_08;
  JSValue this_obj_00;
  JSValue v_11;
  JSValue v_12;
  JSValue v_13;
  JSValue val_09;
  JSValue val_10;
  JSValue v_14;
  JSValue v_15;
  JSValue holder;
  JSValue JVar1;
  JSValue v_16;
  JSValue v_17;
  JSValue v_18;
  int64_t iVar2;
  int iVar3;
  JSValueUnion in_RCX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSValueUnion in_RDI;
  int64_t in_R8;
  JSValue JVar4;
  JSValue in_stack_00000060;
  JSString *p_2;
  int n_1;
  JSObject *p_1;
  JSObject *p;
  JSValue present;
  int64_t n;
  int64_t j;
  int64_t i;
  int res;
  JSValue wrapper;
  JSValue space;
  JSValue v;
  JSValue val;
  JSONStringifyContext *jsc;
  JSONStringifyContext jsc_s;
  StringBuffer b_s;
  JSValue ret;
  undefined4 in_stack_fffffffffffffcb8;
  JSAtom in_stack_fffffffffffffcbc;
  JSValueUnion in_stack_fffffffffffffcc0;
  JSValueUnion in_stack_fffffffffffffcc8;
  JSValueUnion in_stack_fffffffffffffcd0;
  JSValueUnion JVar5;
  int64_t *in_stack_fffffffffffffcd8;
  JSContext *in_stack_fffffffffffffce0;
  JSValueUnion in_stack_fffffffffffffce8;
  JSValueUnion in_stack_fffffffffffffcf0;
  JSValueUnion in_stack_fffffffffffffcf8;
  JSValueUnion JVar6;
  JSContext *ctx_00;
  JSValueUnion JVar7;
  JSValueUnion ctx_01;
  undefined4 in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  JSValueUnion in_stack_fffffffffffffd20;
  int64_t in_stack_fffffffffffffd28;
  int64_t local_2d0;
  undefined4 in_stack_fffffffffffffd38;
  uint in_stack_fffffffffffffd3c;
  JSContext *in_stack_fffffffffffffd40;
  JSValue in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd58 [16];
  undefined1 in_stack_fffffffffffffd68 [16];
  JSValue in_stack_fffffffffffffd78;
  JSValueUnion local_278;
  int64_t local_270;
  JSValueUnion local_268;
  int64_t local_260;
  JSValue in_stack_fffffffffffffdb0;
  JSValueUnion local_238;
  int64_t local_230;
  JSValueUnion local_228;
  int64_t local_220;
  JSValueUnion local_210;
  int64_t local_208;
  JSValueUnion local_1c8;
  JSValueUnion local_1a8;
  int64_t local_1a0;
  JSValueUnion local_198;
  int64_t local_190;
  JSValueUnion local_168;
  int64_t local_160;
  uint uStack_154;
  uint uStack_144;
  uint uStack_134;
  uint uStack_124;
  long local_118;
  long local_108;
  JSValueUnion local_e8;
  int64_t local_e0;
  JSValueUnion local_b0;
  int64_t local_a8;
  JSValueUnion local_a0;
  int64_t local_98;
  JSValueUnion local_90;
  int64_t local_88;
  JSValueUnion local_80;
  int64_t local_78;
  JSValueUnion local_70;
  JSValueUnion local_68;
  undefined1 *local_60;
  undefined1 local_58 [24];
  JSONStringifyContext *in_stack_ffffffffffffffc0;
  JSValueUnion local_10;
  int64_t local_8;
  
  ctx_00 = (JSContext *)&stack0x00000008;
  JVar5.ptr = &local_b0;
  local_b0.ptr = (void *)((ulong)uStack_124 << 0x20);
  local_a8 = 3;
  local_a0.ptr = (void *)((ulong)uStack_134 << 0x20);
  local_98 = 3;
  local_90.ptr = (void *)((ulong)uStack_144 << 0x20);
  local_88 = 3;
  local_80.ptr = (void *)((ulong)uStack_154 << 0x20);
  local_78 = 3;
  local_60 = local_58;
  JVar7.ptr = JVar5.ptr;
  JVar4 = JS_AtomToString((JSContext *)in_stack_fffffffffffffcc0.ptr,in_stack_fffffffffffffcbc);
  local_168 = JVar4.u;
  ctx_01 = JVar7;
  *(JSValueUnion *)((long)JVar7.ptr + 0x40) = local_168;
  local_160 = JVar4.tag;
  *(int64_t *)((long)JVar7.ptr + 0x48) = local_160;
  string_buffer_init((JSContext *)in_stack_fffffffffffffcc0.ptr,
                     (StringBuffer *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),0
                    );
  JVar7.ptr = JVar5.ptr;
  JVar4 = JS_NewArray((JSContext *)in_stack_fffffffffffffcc0.ptr);
  local_198 = JVar4.u;
  *(JSValueUnion *)((long)JVar7.ptr + 0x10) = local_198;
  local_190 = JVar4.tag;
  *(int64_t *)((long)JVar7.ptr + 0x18) = local_190;
  JVar4.tag = local_98;
  JVar4.u.float64 = local_a0.float64;
  iVar3 = JS_IsException(JVar4);
  if (iVar3 == 0) {
    val_09.tag = in_R8;
    val_09.u.float64 = in_RCX.float64;
    iVar3 = JS_IsFunction((JSContext *)in_RDI.ptr,val_09);
    JVar6 = in_RCX;
    iVar2 = in_R8;
    if (iVar3 == 0) {
      val_01.tag = (int64_t)in_stack_fffffffffffffcc8.ptr;
      val_01.u.ptr = in_stack_fffffffffffffcc0.ptr;
      iVar3 = JS_IsArray((JSContext *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),
                         val_01);
      if (iVar3 < 0) goto LAB_0014886c;
      JVar6 = local_b0;
      iVar2 = local_a8;
      if (iVar3 != 0) {
        JVar6.ptr = JVar5.ptr;
        JVar4 = JS_NewArray((JSContext *)in_stack_fffffffffffffcc0.ptr);
        local_1a8 = JVar4.u;
        in_stack_fffffffffffffcf8 = JVar6;
        *(JSValueUnion *)((long)JVar6.ptr + 0x20) = local_1a8;
        local_1a0 = JVar4.tag;
        *(int64_t *)((long)JVar6.ptr + 0x28) = local_1a0;
        v_16.tag = local_88;
        v_16.u.float64 = local_90.float64;
        iVar3 = JS_IsException(v_16);
        if ((iVar3 != 0) ||
           (obj_00.tag = (int64_t)in_stack_fffffffffffffcf0.ptr,
           obj_00.u.float64 = in_stack_fffffffffffffce8.float64,
           iVar3 = js_get_length64(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,obj_00),
           iVar3 != 0)) goto LAB_0014886c;
        local_108 = 0;
        while( true ) {
          JVar6 = local_b0;
          iVar2 = local_a8;
          if (local_118 <= local_108) break;
          obj_01.tag._0_4_ = JVar7.int32;
          obj_01.u.float64 = ctx_01.float64;
          obj_01.tag._4_4_ = JVar7._4_4_;
          JVar4 = JS_GetPropertyInt64(ctx_00,obj_01,(int64_t)in_stack_fffffffffffffcf8);
          local_1c8 = JVar4.u;
          iVar3 = JS_IsException(JVar4);
          if (iVar3 != 0) goto LAB_0014886c;
          iVar3 = JS_IsObject(JVar4);
          if (iVar3 == 0) {
            iVar3 = JS_IsNumber(JVar4);
            if (iVar3 == 0) {
              iVar3 = JS_IsString(JVar4);
              if (iVar3 == 0) {
                v_01.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
                v_01.u.ptr = in_stack_fffffffffffffcc8.ptr;
                JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_01);
                goto LAB_00148227;
              }
            }
            else {
              val_03.tag = (int64_t)in_stack_fffffffffffffcd8;
              val_03.u.ptr = in_stack_fffffffffffffcd0.ptr;
              JVar4 = JS_ToStringFree((JSContext *)in_stack_fffffffffffffcc8.ptr,val_03);
              iVar3 = JS_IsException(JVar4);
              if (iVar3 != 0) goto LAB_0014886c;
            }
LAB_0014810a:
            JVar4 = js_array_includes(in_stack_fffffffffffffd68._8_8_,in_stack_fffffffffffffd78,
                                      in_stack_fffffffffffffd68._4_4_,
                                      in_stack_fffffffffffffd58._8_8_);
            iVar3 = JS_IsException(JVar4);
            if (iVar3 != 0) {
              v_02.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
              v_02.u.ptr = in_stack_fffffffffffffcc8.ptr;
              JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_02);
              goto LAB_0014886c;
            }
            val_06.tag = (int64_t)in_stack_fffffffffffffcf8.ptr;
            val_06.u.ptr = in_stack_fffffffffffffcf0.ptr;
            iVar3 = JS_ToBoolFree((JSContext *)in_stack_fffffffffffffce8.ptr,val_06);
            if (iVar3 == 0) {
              this_obj.tag._0_4_ = (int)ctx_00;
              this_obj.u.ptr = in_stack_fffffffffffffcf8.ptr;
              this_obj.tag._4_4_ = (int)((ulong)ctx_00 >> 0x20);
              val_05.tag = (int64_t)in_stack_fffffffffffffcf0.ptr;
              val_05.u.ptr = in_stack_fffffffffffffce8.ptr;
              JS_SetPropertyInt64(in_stack_fffffffffffffce0,this_obj,
                                  (int64_t)in_stack_fffffffffffffcd8,val_05);
            }
            else {
              v_03.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
              v_03.u.ptr = in_stack_fffffffffffffcc8.ptr;
              JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_03);
            }
          }
          else {
            if ((*(short *)((long)local_1c8.ptr + 6) == 5) ||
               (*(short *)((long)local_1c8.ptr + 6) == 4)) {
              val_02.tag = (int64_t)in_stack_fffffffffffffcd8;
              val_02.u.ptr = in_stack_fffffffffffffcd0.ptr;
              JVar4 = JS_ToStringFree((JSContext *)in_stack_fffffffffffffcc8.ptr,val_02);
              iVar3 = JS_IsException(JVar4);
              if (iVar3 == 0) goto LAB_0014810a;
              goto LAB_0014886c;
            }
            v_00.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
            v_00.u.ptr = in_stack_fffffffffffffcc8.ptr;
            JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_00);
          }
LAB_00148227:
          local_108 = local_108 + 1;
        }
      }
    }
    local_a8 = iVar2;
    local_b0 = JVar6;
    JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,*(JSValue *)&ctx_00->header);
    local_210 = JVar4.u;
    local_e8.float64 = local_210.float64;
    local_208 = JVar4.tag;
    local_e0 = local_208;
    iVar3 = JS_IsObject(JVar4);
    if (iVar3 != 0) {
      if (*(short *)((long)local_210.ptr + 6) == 4) {
        val_00.u._4_4_ = in_stack_fffffffffffffcbc;
        val_00.u.int32 = in_stack_fffffffffffffcb8;
        val_00.tag = (int64_t)in_stack_fffffffffffffcc0.ptr;
        JVar4 = JS_ToNumberFree((JSContext *)0x1482e9,val_00);
        local_228 = JVar4.u;
        local_e8 = local_228;
        local_220 = JVar4.tag;
        local_e0 = local_220;
      }
      else if (*(short *)((long)local_210.ptr + 6) == 5) {
        val_04.tag = (int64_t)in_stack_fffffffffffffcd8;
        val_04.u.ptr = in_stack_fffffffffffffcd0.ptr;
        JVar4 = JS_ToStringFree((JSContext *)in_stack_fffffffffffffcc8.ptr,val_04);
        local_238 = JVar4.u;
        local_e8 = local_238;
        local_230 = JVar4.tag;
        local_e0 = local_230;
      }
      v_11.tag = local_e0;
      v_11.u.float64 = local_e8.float64;
      iVar3 = JS_IsException(v_11);
      if (iVar3 != 0) {
        v_04.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
        v_04.u.ptr = in_stack_fffffffffffffcc8.ptr;
        JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_04);
        goto LAB_0014886c;
      }
    }
    v_12.tag = local_e0;
    v_12.u.float64 = local_e8.float64;
    iVar3 = JS_IsNumber(v_12);
    if (iVar3 == 0) {
      v_13.tag = local_e0;
      v_13.u.float64 = local_e8.float64;
      iVar3 = JS_IsString(v_13);
      if (iVar3 == 0) {
        v_18.tag = (int64_t)local_68.ptr;
        v_18.u.float64 = local_70.float64;
        JVar4 = JS_DupValue((JSContext *)in_RDI.ptr,v_18);
        local_278 = JVar4.u;
        *(JSValueUnion *)((long)JVar5.ptr + 0x30) = local_278;
        local_270 = JVar4.tag;
        *(int64_t *)((long)JVar5.ptr + 0x38) = local_270;
        in_stack_fffffffffffffcd0 = JVar5;
      }
      else {
        min_int((uint)*(undefined8 *)((long)local_e8.ptr + 4) & 0x7fffffff,10);
        JVar4 = js_sub_string((JSContext *)in_stack_fffffffffffffcf0.ptr,(JSString *)JVar5.ptr,
                              local_e8._4_4_,local_e8.int32);
        local_268 = JVar4.u;
        *(JSValueUnion *)((long)JVar5.ptr + 0x30) = local_268;
        local_260 = JVar4.tag;
        *(int64_t *)((long)JVar5.ptr + 0x38) = local_260;
      }
    }
    else {
      val_07.tag._0_4_ = (int)ctx_00;
      val_07.u.float64 = in_stack_fffffffffffffcf8.float64;
      val_07.tag._4_4_ = (int)((ulong)ctx_00 >> 0x20);
      iVar3 = JS_ToInt32Clamp((JSContext *)in_stack_fffffffffffffcf0.ptr,
                              (int *)in_stack_fffffffffffffce8.ptr,val_07,
                              (int)((ulong)in_stack_fffffffffffffce0 >> 0x20),
                              (int)in_stack_fffffffffffffce0,JVar7.int32);
      if (iVar3 != 0) goto LAB_0014886c;
      in_stack_fffffffffffffdb0 =
           JS_NewStringLen((JSContext *)in_stack_fffffffffffffd20.ptr,
                           (char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                           (size_t)JVar7);
      *(JSValueUnion *)((long)JVar5.ptr + 0x30) = in_stack_fffffffffffffdb0.u;
      *(int64_t *)((long)JVar5.ptr + 0x38) = in_stack_fffffffffffffdb0.tag;
    }
    v_05.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
    v_05.u.float64 = in_stack_fffffffffffffcc8.float64;
    JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_05);
    v_17.tag = local_78;
    v_17.u.float64 = local_80.float64;
    iVar3 = JS_IsException(v_17);
    if (iVar3 != 0) goto LAB_0014886c;
    JVar4 = JS_NewObject((JSContext *)0x1485d1);
    iVar3 = JS_IsException(JVar4);
    if (iVar3 != 0) goto LAB_0014886c;
    v_14.tag = in_RDX;
    v_14.u.ptr = in_RSI.ptr;
    JVar5 = in_RDI;
    JS_DupValue((JSContext *)in_RDI.ptr,v_14);
    this_obj_00.tag = in_stack_fffffffffffffd28;
    this_obj_00.u.float64 = in_stack_fffffffffffffd20.float64;
    val_08.tag._0_4_ = in_stack_fffffffffffffd18;
    val_08.u.float64 = JVar7.float64;
    val_08.tag._4_4_ = in_stack_fffffffffffffd1c;
    iVar3 = JS_DefinePropertyValue
                      ((JSContext *)ctx_01.ptr,this_obj_00,(JSAtom)((ulong)ctx_00 >> 0x20),val_08,
                       (int)in_stack_fffffffffffffd40);
    in_stack_fffffffffffffcc8 = in_RDI;
    if (iVar3 < 0) goto LAB_0014886c;
    v_15.tag = in_RDX;
    v_15.u.ptr = in_RSI.ptr;
    JVar4 = JS_DupValue((JSContext *)JVar5.ptr,v_15);
    in_stack_fffffffffffffcc0 = local_68;
    JVar4 = js_json_check(in_stack_fffffffffffffd40,
                          (JSONStringifyContext *)
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),JVar4,
                          in_stack_fffffffffffffd48,in_stack_fffffffffffffdb0);
    iVar3 = JS_IsException(JVar4);
    in_stack_fffffffffffffcc8 = in_RDI;
    if (iVar3 != 0) goto LAB_0014886c;
    iVar3 = JS_IsUndefined(JVar4);
    if (iVar3 == 0) {
      holder.tag = in_RDX;
      holder.u.float64 = in_RSI.float64;
      val_10.tag = in_R8;
      val_10.u.float64 = in_RCX.float64;
      iVar3 = js_json_to_str((JSContext *)JVar5.ptr,in_stack_ffffffffffffffc0,holder,val_10,
                             in_stack_00000060);
      in_stack_fffffffffffffcc0 = local_68;
      in_stack_fffffffffffffcc8 = in_RDI;
      if (iVar3 == 0) {
        JVar4 = string_buffer_end((StringBuffer *)local_68.ptr);
        local_10 = JVar4.u;
        local_2d0 = JVar4.tag;
        local_8 = local_2d0;
        in_stack_fffffffffffffcc0 = local_68;
        goto LAB_001488a8;
      }
      goto LAB_0014886c;
    }
    local_8 = 3;
  }
  else {
LAB_0014886c:
    local_8 = 6;
    in_RDI = in_stack_fffffffffffffcc8;
    in_stack_fffffffffffffd3c = in_stack_fffffffffffffd1c;
  }
  local_10.ptr = (void *)((ulong)in_stack_fffffffffffffd3c << 0x20);
  string_buffer_free((StringBuffer *)0x1488a8);
LAB_001488a8:
  v_06.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
  v_06.u.ptr = in_RDI.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_06);
  v_07.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
  v_07.u.ptr = in_RDI.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_07);
  v_08.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
  v_08.u.ptr = in_RDI.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_08);
  v_09.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
  v_09.u.ptr = in_RDI.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_09);
  v_10.tag = (int64_t)in_stack_fffffffffffffcd0.ptr;
  v_10.u.ptr = in_RDI.ptr;
  JS_FreeValue((JSContext *)in_stack_fffffffffffffcc0.ptr,v_10);
  JVar1.tag = local_8;
  JVar1.u.ptr = local_10.ptr;
  return JVar1;
}

Assistant:

JSValue JS_JSONStringify(JSContext *ctx, JSValueConst obj,
                         JSValueConst replacer, JSValueConst space0)
{
    StringBuffer b_s;
    JSONStringifyContext jsc_s, *jsc = &jsc_s;
    JSValue val, v, space, ret, wrapper;
    int res;
    int64_t i, j, n;

    jsc->replacer_func = JS_UNDEFINED;
    jsc->stack = JS_UNDEFINED;
    jsc->property_list = JS_UNDEFINED;
    jsc->gap = JS_UNDEFINED;
    jsc->b = &b_s;
    jsc->empty = JS_AtomToString(ctx, JS_ATOM_empty_string);
    ret = JS_UNDEFINED;
    wrapper = JS_UNDEFINED;

    string_buffer_init(ctx, jsc->b, 0);
    jsc->stack = JS_NewArray(ctx);
    if (JS_IsException(jsc->stack))
        goto exception;
    if (JS_IsFunction(ctx, replacer)) {
        jsc->replacer_func = replacer;
    } else {
        res = JS_IsArray(ctx, replacer);
        if (res < 0)
            goto exception;
        if (res) {
            /* XXX: enumeration is not fully correct */
            jsc->property_list = JS_NewArray(ctx);
            if (JS_IsException(jsc->property_list))
                goto exception;
            if (js_get_length64(ctx, &n, replacer))
                goto exception;
            for (i = j = 0; i < n; i++) {
                JSValue present;
                v = JS_GetPropertyInt64(ctx, replacer, i);
                if (JS_IsException(v))
                    goto exception;
                if (JS_IsObject(v)) {
                    JSObject *p = JS_VALUE_GET_OBJ(v);
                    if (p->class_id == JS_CLASS_STRING ||
                        p->class_id == JS_CLASS_NUMBER) {
                        v = JS_ToStringFree(ctx, v);
                        if (JS_IsException(v))
                            goto exception;
                    } else {
                        JS_FreeValue(ctx, v);
                        continue;
                    }
                } else if (JS_IsNumber(v)) {
                    v = JS_ToStringFree(ctx, v);
                    if (JS_IsException(v))
                        goto exception;
                } else if (!JS_IsString(v)) {
                    JS_FreeValue(ctx, v);
                    continue;
                }
                present = js_array_includes(ctx, jsc->property_list,
                                            1, (JSValueConst *)&v);
                if (JS_IsException(present)) {
                    JS_FreeValue(ctx, v);
                    goto exception;
                }
                if (!JS_ToBoolFree(ctx, present)) {
                    JS_SetPropertyInt64(ctx, jsc->property_list, j++, v);
                } else {
                    JS_FreeValue(ctx, v);
                }
            }
        }
    }
    space = JS_DupValue(ctx, space0);
    if (JS_IsObject(space)) {
        JSObject *p = JS_VALUE_GET_OBJ(space);
        if (p->class_id == JS_CLASS_NUMBER) {
            space = JS_ToNumberFree(ctx, space);
        } else if (p->class_id == JS_CLASS_STRING) {
            space = JS_ToStringFree(ctx, space);
        }
        if (JS_IsException(space)) {
            JS_FreeValue(ctx, space);
            goto exception;
        }
    }
    if (JS_IsNumber(space)) {
        int n;
        if (JS_ToInt32Clamp(ctx, &n, space, 0, 10, 0))
            goto exception;
        jsc->gap = JS_NewStringLen(ctx, "          ", n);
    } else if (JS_IsString(space)) {
        JSString *p = JS_VALUE_GET_STRING(space);
        jsc->gap = js_sub_string(ctx, p, 0, min_int(p->len, 10));
    } else {
        jsc->gap = JS_DupValue(ctx, jsc->empty);
    }
    JS_FreeValue(ctx, space);
    if (JS_IsException(jsc->gap))
        goto exception;
    wrapper = JS_NewObject(ctx);
    if (JS_IsException(wrapper))
        goto exception;
    if (JS_DefinePropertyValue(ctx, wrapper, JS_ATOM_empty_string,
                               JS_DupValue(ctx, obj), JS_PROP_C_W_E) < 0)
        goto exception;
    val = JS_DupValue(ctx, obj);
                           
    val = js_json_check(ctx, jsc, wrapper, val, jsc->empty);
    if (JS_IsException(val))
        goto exception;
    if (JS_IsUndefined(val)) {
        ret = JS_UNDEFINED;
        goto done1;
    }
    if (js_json_to_str(ctx, jsc, wrapper, val, jsc->empty))
        goto exception;

    ret = string_buffer_end(jsc->b);
    goto done;

exception:
    ret = JS_EXCEPTION;
done1:
    string_buffer_free(jsc->b);
done:
    JS_FreeValue(ctx, wrapper);
    JS_FreeValue(ctx, jsc->empty);
    JS_FreeValue(ctx, jsc->gap);
    JS_FreeValue(ctx, jsc->property_list);
    JS_FreeValue(ctx, jsc->stack);
    return ret;
}